

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorseInteractionType.hpp
# Opt level: O2

void __thiscall
OpenMD::MorseInteractionType::MorseInteractionType
          (MorseInteractionType *this,RealType myD0,RealType myBeta0,RealType myR0,MorseType myType)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_00223de8;
  this->D0 = myD0;
  this->beta0 = myBeta0;
  this->r0 = myR0;
  this->interactionType = myType;
  NonBondedInteractionType::setMorse(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

MorseInteractionType(RealType myD0, RealType myBeta0, RealType myR0,
                         MorseType myType) {
      D0              = myD0;
      beta0           = myBeta0;
      r0              = myR0;
      interactionType = myType;
      setMorse();
    }